

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O3

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<float,float>
          (float v1,float v2,Nonnull<const_char_*> exprtext)

{
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  undefined1 local_180 [376];
  
  CheckOpMessageBuilder::CheckOpMessageBuilder((CheckOpMessageBuilder *)local_180,exprtext);
  std::ostream::_M_insert<double>((double)v1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180," vs. ",5);
  std::ostream::_M_insert<double>((double)v2);
  pcVar1 = CheckOpMessageBuilder::NewString((CheckOpMessageBuilder *)local_180);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  std::ios_base::~ios_base((ios_base *)(local_180 + 0x70));
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}